

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O0

double __thiscall Net::accuracy(Net *this,Table *Xtest,Table *Ytest)

{
  Table *pTVar1;
  int iVar2;
  ostream *poVar3;
  double dVar4;
  Table local_118;
  Table local_a0;
  int local_34;
  double dStack_30;
  int i;
  double TrueAnswers;
  Table *pTStack_20;
  int tests;
  Table *Ytest_local;
  Table *Xtest_local;
  Net *this_local;
  
  pTStack_20 = Ytest;
  Ytest_local = Xtest;
  Xtest_local = (Table *)this;
  TrueAnswers._4_4_ = Table::get_rows(Xtest);
  dStack_30 = 0.0;
  for (local_34 = 0; pTVar1 = Ytest_local, local_34 < TrueAnswers._4_4_; local_34 = local_34 + 1) {
    iVar2 = Table::get_cols(Ytest_local);
    Table::slice(&local_a0,pTVar1,0,iVar2,local_34,local_34 + 1);
    iVar2 = predict(this,&local_a0);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    poVar3 = std::operator<<(poVar3,' ');
    dVar4 = Table::get_value(pTStack_20,0,local_34);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
    std::operator<<(poVar3,'\n');
    Table::~Table(&local_a0);
    pTVar1 = Ytest_local;
    iVar2 = Table::get_cols(Ytest_local);
    Table::slice(&local_118,pTVar1,0,iVar2,local_34,local_34 + 1);
    iVar2 = predict(this,&local_118);
    dVar4 = Table::get_value(pTStack_20,0,local_34);
    Table::~Table(&local_118);
    if (((double)iVar2 == dVar4) && (!NAN((double)iVar2) && !NAN(dVar4))) {
      dStack_30 = dStack_30 + 1.0;
    }
  }
  return dStack_30 / (double)TrueAnswers._4_4_;
}

Assistant:

double Net::accuracy(Table &Xtest, Table &Ytest) {
    int tests = Xtest.get_rows();
    double TrueAnswers = 0;
    for (int i = 0; i < tests; ++i){
        std::cout << predict(Xtest.slice(0, Xtest.get_cols(), i, i + 1)) << ' ' << Ytest.get_value(0, i) << '\n';
        if (predict(Xtest.slice(0, Xtest.get_cols(), i, i + 1)) == Ytest.get_value(0, i))
            TrueAnswers++;
    }
    return TrueAnswers / (double)tests;
}